

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_posix.cpp
# Opt level: O1

void __thiscall pstore::file::file_handle::unlock(file_handle *this,uint64_t offset,size_t size)

{
  pointer pcVar1;
  int iVar2;
  int *piVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  undefined8 local_38;
  uint64_t uStack_30;
  size_t local_28;
  undefined8 uStack_20;
  
  if ((long)(size | offset) < 0) {
    raise<std::errc,char[5]>(invalid_argument,(char (*) [5])"lock");
  }
  if (this->file_ != -1) {
    local_38 = 2;
    uStack_20 = 0;
    uStack_30 = offset;
    local_28 = size;
    iVar2 = fcntl(this->file_,6,&local_38);
    if (iVar2 == 0) {
      return;
    }
    piVar3 = __errno_location();
    iVar2 = *piVar3;
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    pcVar1 = (this->path_)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_58,pcVar1,pcVar1 + (this->path_)._M_string_length);
    (anonymous_namespace)::raise_file_error<char_const*,std::__cxx11::string>
              (iVar2,"fcntl/unlock failed",&local_58);
  }
  raise<std::errc>(bad_file_descriptor);
}

Assistant:

void file_handle::unlock (std::uint64_t const offset, std::size_t const size) {
            if (offset > uoff_max || size > uoff_max) {
                raise (std::errc::invalid_argument, "lock");
            }
            this->ensure_open ();
            if (file_handle::lock_reg (file_, F_SETLK,
                                       F_UNLCK, // release an existing lock
                                       static_cast<off_t> (offset), SEEK_SET,
                                       static_cast<off_t> (size)) != 0) {
                int const err = errno;
                raise_file_error (err, "fcntl/unlock failed", this->path ());
            }
        }